

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTest.c
# Opt level: O3

void Gia_ParTestSimulate2(Gia_Man_t *p,int nWords,int nProcs)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *__ptr;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 *__arg;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  pthread_t *__newthread;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Par_ThData_t ThData [100];
  pthread_t WorkerThread [100];
  undefined8 local_998;
  uint local_990 [398];
  pthread_t local_358 [101];
  
  if (100 < nProcs) {
    __assert_fail("nProcs <= PAR_THR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0xf2,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
  }
  Gia_ManRandom(1);
  if (p->pData != (void *)0x0) {
    __assert_fail("!p->pData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0x30,"void Gia_ParTestAlloc(Gia_Man_t *, int)");
  }
  pvVar5 = malloc((long)p->nObjs * (long)nWords * 8);
  p->pData = pvVar5;
  p->iData = nWords;
  Gia_ParTestSimulateInit(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  lVar13 = (long)p->vCis->nSize;
  if (0 < lVar13) {
    do {
      if (p->vCis->nSize < lVar13) {
LAB_003b760c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,p->vCis->pArray[lVar13 + -1]);
      bVar3 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar3);
  }
  uVar11 = 0;
  Vec_IntPush(p_00,0);
  Gia_ManStaticFanoutStart(p);
  __ptr = Gia_ManCreateFaninCounts(p);
  iVar1 = __ptr->nSize;
  uVar12 = (ulong)iVar1;
  if (0 < (long)uVar12) {
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + __ptr->pArray[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  uVar9 = (ulong)(uint)nProcs;
  if (0 < nProcs) {
    __newthread = local_358;
    __arg = &local_998;
    uVar15 = uVar9;
    do {
      *__arg = p;
      __arg[1] = 0xffffffff;
      iVar4 = pthread_create(__newthread,(pthread_attr_t *)0x0,Gia_ParWorkerThread,__arg);
      if (iVar4 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                      ,0x104,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
      }
      __newthread = __newthread + 1;
      __arg = __arg + 2;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  while ((0 < (int)uVar11 || (0 < p_00->nSize))) {
    if (0 < nProcs) {
      uVar15 = 0;
      do {
        if (local_990[uVar15 * 4 + 1] == 0) {
          uVar7 = local_990[uVar15 * 4];
          if (-1 < (int)uVar7) {
            uVar14 = 0;
            while( true ) {
              if (p->vFanoutNums->nSize <= (int)uVar7) goto LAB_003b760c;
              if (p->vFanoutNums->pArray[uVar7] <= (int)uVar14) break;
              uVar2 = p->vFanout->nSize;
              if ((int)uVar2 <= (int)uVar7) goto LAB_003b760c;
              piVar6 = p->vFanout->pArray;
              uVar7 = piVar6[uVar7] + uVar14;
              if (((int)uVar7 < 0) || (uVar2 <= uVar7)) goto LAB_003b760c;
              iVar4 = piVar6[uVar7];
              lVar13 = (long)iVar4;
              if ((lVar13 < 0) || (iVar1 <= iVar4)) goto LAB_003b760c;
              iVar8 = __ptr->pArray[lVar13];
              if (iVar8 < 1) {
                __assert_fail("Vec_IntEntry(vFanins, iFan) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                              ,0x111,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
              }
              iVar8 = iVar8 + -1;
              __ptr->pArray[lVar13] = iVar8;
              if (iVar8 == 0) {
                Vec_IntPush(p_00,iVar4);
              }
              if ((~((int)uVar11 >> 0x1f) & uVar11) == uVar14) {
                __assert_fail("nCountFanins > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                              ,0x114,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
              }
              uVar14 = uVar14 + 1;
              uVar7 = local_990[uVar15 * 4];
              if ((int)uVar7 < 0) goto LAB_003b760c;
            }
            local_990[uVar15 * 4] = 0xffffffff;
            uVar11 = uVar11 - uVar14;
          }
          if (0 < p_00->nSize) {
            uVar7 = p_00->nSize - 1;
            p_00->nSize = uVar7;
            local_990[uVar15 * 4] = p_00->pArray[uVar7];
            local_990[uVar15 * 4 + 1] = 1;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar9);
    }
  }
  if (0 < iVar1) {
    piVar6 = __ptr->pArray;
    uVar15 = 0;
    do {
      if (piVar6[uVar15] != 0) {
        printf("%d -> %d    ",uVar15 & 0xffffffff);
        if ((long)p->nObjs <= (long)uVar15) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Gia_ObjPrint(p,p->pObjs + uVar15);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar12);
  }
  do {
    uVar12 = 0;
    if (0 < nProcs) {
      uVar12 = 0;
      puVar10 = local_990 + 1;
      while (*puVar10 == 0) {
        uVar12 = uVar12 + 1;
        puVar10 = puVar10 + 4;
        if (uVar9 == uVar12) goto LAB_003b755d;
      }
    }
  } while ((int)uVar12 != nProcs);
LAB_003b755d:
  if (0 < nProcs) {
    lVar13 = 0;
    do {
      if (*(int *)((long)local_990 + lVar13 + 4) != 0) {
        __assert_fail("ThData[i].Status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                      ,0x132,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
      }
      *(undefined8 *)((long)local_990 + lVar13) = 0x1ffffffff;
      lVar13 = lVar13 + 0x10;
    } while (uVar9 * 0x10 != lVar13);
  }
  Gia_ManStaticFanoutStop(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (p->pData != (void *)0x0) {
    free(p->pData);
    p->pData = (void *)0x0;
  }
  p->iData = 0;
  return;
}

Assistant:

void Gia_ParTestSimulate2( Gia_Man_t * p, int nWords, int nProcs )
{
	pthread_t WorkerThread[PAR_THR_MAX];
    Par_ThData_t ThData[PAR_THR_MAX];
    Vec_Int_t * vStack, * vFanins;
    int i, k, iFan, status, nCountFanins;
    assert( nProcs <= PAR_THR_MAX );
    Gia_ManRandom( 1 );
    Gia_ParTestAlloc( p, nWords );
    Gia_ParTestSimulateInit( p );
    // start the stack
    vStack = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryReverse( p->vCis, iFan, i )
        Vec_IntPush( vStack, iFan );
    Vec_IntPush( vStack, 0 );
    Gia_ManStaticFanoutStart( p );
    vFanins = Gia_ManCreateFaninCounts( p );
    nCountFanins = Vec_IntSum(vFanins);
    // start the threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p = p;
        ThData[i].Id = -1;
        ThData[i].Status = 0;
        status = pthread_create( WorkerThread + i, NULL, Gia_ParWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    while ( nCountFanins > 0 || Vec_IntSize(vStack) > 0 )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].Status )
                continue;
            assert( ThData[i].Status == 0 );
            if ( ThData[i].Id >= 0 )
            {
                Gia_ObjForEachFanoutStaticId( p, ThData[i].Id, iFan, k )
                {
                    assert( Vec_IntEntry(vFanins, iFan) > 0 );
                    if ( Vec_IntAddToEntry(vFanins, iFan, -1) == 0 )
                        Vec_IntPush( vStack, iFan );
                    assert( nCountFanins > 0 );
                    nCountFanins--;
                }
                ThData[i].Id = -1;
            }
            if ( Vec_IntSize(vStack) > 0 )
            {
                ThData[i].Id = Vec_IntPop( vStack );
                ThData[i].Status = 1;
            }
        }
    }
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( iFan != 0 )
        {
            printf( "%d -> %d    ", k, iFan );
            Gia_ObjPrint( p, Gia_ManObj(p, k) );
        }
//    assert( Vec_IntSum(vFanins) == 0 );
    // stop the threads
    while ( 1 )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].Status )
                break;
        if ( i == nProcs )
            break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        assert( ThData[i].Status == 0 );
        ThData[i].Id = -1;
        ThData[i].Status = 1;
    }
    Gia_ManStaticFanoutStop( p );
    Vec_IntFree( vStack );
    Vec_IntFree( vFanins );
//    Gia_ParComputeSignature( p, nWords ); printf( "   " );
    Gia_ParTestFree( p );
}